

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  size_t _totals;
  int iVar1;
  IStreamingReporter *pIVar2;
  GroupInfo local_d0;
  TestGroupStats local_a0;
  size_t local_30;
  size_t groupsCount_local;
  size_t groupIndex_local;
  Totals *totals_local;
  string *testSpec_local;
  RunContext *this_local;
  
  local_30 = groupsCount;
  groupsCount_local = groupIndex;
  groupIndex_local = (size_t)totals;
  totals_local = (Totals *)testSpec;
  testSpec_local = (string *)this;
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  GroupInfo::GroupInfo(&local_d0,(string *)totals_local,groupsCount_local,local_30);
  _totals = groupIndex_local;
  iVar1 = (*(this->super_IResultCapture)._vptr_IResultCapture[10])();
  TestGroupStats::TestGroupStats(&local_a0,&local_d0,(Totals *)_totals,(bool)((byte)iVar1 & 1));
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(pIVar2,&local_a0);
  TestGroupStats::~TestGroupStats(&local_a0);
  GroupInfo::~GroupInfo(&local_d0);
  return;
}

Assistant:

void testGroupEnded( std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount ) {
            m_reporter->testGroupEnded( TestGroupStats( GroupInfo( testSpec, groupIndex, groupsCount ), totals, aborting() ) );
        }